

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

void * __thiscall cppnet::PoolAlloter::ChunkAlloc(PoolAlloter *this,uint32_t size,uint32_t *nums)

{
  uint32_t uVar1;
  value_type pMVar2;
  uint size_00;
  uint32_t uVar3;
  int iVar4;
  reference ppMVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  MemNode *my_free;
  uint32_t bytes_to_get;
  uint32_t left_bytes;
  uint32_t need_bytes;
  char *res;
  uint32_t *nums_local;
  uint32_t size_local;
  PoolAlloter *this_local;
  
  size_00 = (int)this->_pool_end - (int)this->_pool_start;
  if (size_00 < size * *nums) {
    if (size_00 < size) {
      uVar1 = *nums;
      if (size_00 != 0) {
        uVar3 = FreeListIndex(this,size_00,8);
        ppMVar5 = std::
                  vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
                  ::operator[](&this->_free_list,(ulong)uVar3);
        *(value_type *)this->_pool_start = *ppMVar5;
        pMVar2 = (value_type)this->_pool_start;
        uVar3 = FreeListIndex(this,size,8);
        ppMVar5 = std::
                  vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
                  ::operator[](&this->_free_list,(ulong)uVar3);
        *ppMVar5 = pMVar2;
      }
      peVar6 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_alloter);
      iVar4 = (*peVar6->_vptr_Alloter[2])(peVar6,(ulong)(size * uVar1));
      this->_pool_start = (char *)CONCAT44(extraout_var,iVar4);
      std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->_malloc_vec,&this->_pool_start)
      ;
      this->_pool_end = this->_pool_start + size * uVar1;
      this_local = (PoolAlloter *)ChunkAlloc(this,size,nums);
    }
    else {
      *nums = size_00 / size;
      this_local = (PoolAlloter *)this->_pool_start;
      this->_pool_start = this->_pool_start + size * *nums;
    }
  }
  else {
    this_local = (PoolAlloter *)this->_pool_start;
    this->_pool_start = this->_pool_start + size * *nums;
  }
  return this_local;
}

Assistant:

void* PoolAlloter::ChunkAlloc(uint32_t size, uint32_t& nums) {
    char* res;
    uint32_t need_bytes = size * nums;
    uint32_t left_bytes = uint32_t(_pool_end - _pool_start);

    //pool is enough
    if (left_bytes >= need_bytes) {
        res = _pool_start;
        _pool_start += need_bytes;
        return res;
    
    } else if (left_bytes >= size) {
        nums = left_bytes / size;
        need_bytes = size * nums;
        res = _pool_start;
        _pool_start += need_bytes;
        return res;

    } 
    uint32_t bytes_to_get = size * nums;

    if (left_bytes > 0) {
        MemNode* my_free = _free_list[FreeListIndex(left_bytes)];
        ((MemNode*)_pool_start)->_next = my_free;
        _free_list[FreeListIndex(size)] = (MemNode*)_pool_start;
    }

    _pool_start = (char*)_alloter->Malloc(bytes_to_get);

    _malloc_vec.push_back(_pool_start);
    _pool_end = _pool_start + bytes_to_get;
    return ChunkAlloc(size, nums);
}